

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_Bool Normalize(FT_F26Dot6 Vx,FT_F26Dot6 Vy,FT_UnitVector *R)

{
  undefined1 local_38 [8];
  FT_Vector V;
  FT_UnitVector *R_local;
  FT_F26Dot6 Vy_local;
  FT_F26Dot6 Vx_local;
  
  if ((Vx != 0) || (Vy != 0)) {
    local_38 = (undefined1  [8])Vx;
    V.x = Vy;
    V.y = (FT_Pos)R;
    FT_Vector_NormLen((FT_Vector *)local_38);
    *(short *)V.y = (short)((long)local_38 / 4);
    *(short *)(V.y + 2) = (short)(V.x / 4);
  }
  return '\0';
}

Assistant:

static FT_Bool
  Normalize( FT_F26Dot6      Vx,
             FT_F26Dot6      Vy,
             FT_UnitVector*  R )
  {
    FT_Vector V;


    if ( Vx == 0 && Vy == 0 )
    {
      /* XXX: UNDOCUMENTED! It seems that it is possible to try   */
      /*      to normalize the vector (0,0).  Return immediately. */
      return SUCCESS;
    }

    V.x = Vx;
    V.y = Vy;

    FT_Vector_NormLen( &V );

    R->x = (FT_F2Dot14)( V.x / 4 );
    R->y = (FT_F2Dot14)( V.y / 4 );

    return SUCCESS;
  }